

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O1

void disas_crypto_three_reg_sha(DisasContext_conflict1 *s,uint32_t insn)

{
  TCGContext_conflict1 *tcg_ctx;
  TCGContext_conflict1 *pTVar1;
  bool bVar2;
  uint uVar3;
  uintptr_t o_3;
  TCGTemp *pTVar4;
  TCGv_i64 ret;
  TCGv_i32 pTVar5;
  code *pcVar6;
  uint val;
  uintptr_t o;
  uintptr_t o_1;
  TCGv_i64 ret_00;
  uintptr_t o_2;
  TCGv_i64 ret_01;
  TCGTemp *local_58;
  TCGv_i64 local_50;
  TCGv_i64 local_48;
  TCGTemp *local_40;
  
  if ((insn & 0xc00000) != 0) goto switchD_006b0f05_caseD_7;
  tcg_ctx = s->uc->tcg_ctx;
  val = insn >> 0xc & 7;
  switch(val) {
  default:
    bVar2 = true;
    uVar3 = 0xf00;
    pcVar6 = (code *)0x0;
    goto LAB_006b0f33;
  case 4:
    pcVar6 = gen_helper_crypto_sha256h;
    break;
  case 5:
    pcVar6 = gen_helper_crypto_sha256h2;
    break;
  case 6:
    pcVar6 = gen_helper_crypto_sha256su1;
    break;
  case 7:
    goto switchD_006b0f05_caseD_7;
  }
  uVar3 = 0xf000;
  bVar2 = false;
LAB_006b0f33:
  if (((uint)s->isar->id_aa64isar0 & uVar3) != 0) {
    if (s->fp_access_checked == true) {
      __assert_fail("!s->fp_access_checked",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                    ,0x487,"_Bool fp_access_check(DisasContext *)");
    }
    s->fp_access_checked = true;
    if (s->fp_excp_el != 0) {
      gen_exception_insn(s,s->pc_curr,1,0x1fe0000a,s->fp_excp_el);
      return;
    }
    pTVar1 = s->uc->tcg_ctx;
    pTVar4 = tcg_temp_new_internal_aarch64(pTVar1,TCG_TYPE_I64,false);
    ret = (TCGv_i64)((long)pTVar4 - (long)pTVar1);
    tcg_gen_addi_i64_aarch64
              (pTVar1,ret,(TCGv_i64)pTVar1->cpu_env,(ulong)((insn & 0x1f) * 0x100 + 0xc10));
    pTVar1 = s->uc->tcg_ctx;
    pTVar4 = tcg_temp_new_internal_aarch64(pTVar1,TCG_TYPE_I64,false);
    ret_00 = (TCGv_i64)((long)pTVar4 - (long)pTVar1);
    tcg_gen_addi_i64_aarch64
              (pTVar1,ret_00,(TCGv_i64)pTVar1->cpu_env,(ulong)((insn * 8 & 0x1f00) + 0xc10));
    pTVar1 = s->uc->tcg_ctx;
    pTVar4 = tcg_temp_new_internal_aarch64(pTVar1,TCG_TYPE_I64,false);
    ret_01 = (TCGv_i64)((long)pTVar4 - (long)pTVar1);
    tcg_gen_addi_i64_aarch64
              (pTVar1,ret_01,(TCGv_i64)pTVar1->cpu_env,(ulong)((insn >> 8 & 0x1f00) + 0xc10));
    if (bVar2) {
      pTVar5 = tcg_const_i32_aarch64(tcg_ctx,val);
      local_58 = (TCGTemp *)((long)tcg_ctx + (long)ret);
      local_50 = (TCGv_i64)((long)tcg_ctx + (long)ret_00);
      local_48 = (TCGv_i64)((long)tcg_ctx + (long)ret_01);
      local_40 = (TCGTemp *)(pTVar5 + (long)tcg_ctx);
      tcg_gen_callN_aarch64(tcg_ctx,helper_crypto_sha1_3reg_aarch64,(TCGTemp *)0x0,4,&local_58);
      tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar5 + (long)tcg_ctx));
    }
    else {
      (*pcVar6)(tcg_ctx,ret,ret_00,ret_01);
    }
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(ret_00 + (long)tcg_ctx));
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(ret_01 + (long)tcg_ctx));
    return;
  }
switchD_006b0f05_caseD_7:
  unallocated_encoding_aarch64(s);
  return;
}

Assistant:

static void disas_crypto_three_reg_sha(DisasContext *s, uint32_t insn)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int size = extract32(insn, 22, 2);
    int opcode = extract32(insn, 12, 3);
    int rm = extract32(insn, 16, 5);
    int rn = extract32(insn, 5, 5);
    int rd = extract32(insn, 0, 5);
    CryptoThreeOpFn *genfn;
    TCGv_ptr tcg_rd_ptr, tcg_rn_ptr, tcg_rm_ptr;
    bool feature;

    if (size != 0) {
        unallocated_encoding(s);
        return;
    }

    switch (opcode) {
    case 0: /* SHA1C */
    case 1: /* SHA1P */
    case 2: /* SHA1M */
    case 3: /* SHA1SU0 */
        genfn = NULL;
        feature = dc_isar_feature(aa64_sha1, s);
        break;
    case 4: /* SHA256H */
        genfn = gen_helper_crypto_sha256h;
        feature = dc_isar_feature(aa64_sha256, s);
        break;
    case 5: /* SHA256H2 */
        genfn = gen_helper_crypto_sha256h2;
        feature = dc_isar_feature(aa64_sha256, s);
        break;
    case 6: /* SHA256SU1 */
        genfn = gen_helper_crypto_sha256su1;
        feature = dc_isar_feature(aa64_sha256, s);
        break;
    default:
        unallocated_encoding(s);
        return;
    }

    if (!feature) {
        unallocated_encoding(s);
        return;
    }

    if (!fp_access_check(s)) {
        return;
    }

    tcg_rd_ptr = vec_full_reg_ptr(s, rd);
    tcg_rn_ptr = vec_full_reg_ptr(s, rn);
    tcg_rm_ptr = vec_full_reg_ptr(s, rm);

    if (genfn) {
        genfn(tcg_ctx, tcg_rd_ptr, tcg_rn_ptr, tcg_rm_ptr);
    } else {
        TCGv_i32 tcg_opcode = tcg_const_i32(tcg_ctx, opcode);

        gen_helper_crypto_sha1_3reg(tcg_ctx, tcg_rd_ptr, tcg_rn_ptr,
                                    tcg_rm_ptr, tcg_opcode);
        tcg_temp_free_i32(tcg_ctx, tcg_opcode);
    }

    tcg_temp_free_ptr(tcg_ctx, tcg_rd_ptr);
    tcg_temp_free_ptr(tcg_ctx, tcg_rn_ptr);
    tcg_temp_free_ptr(tcg_ctx, tcg_rm_ptr);
}